

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O3

size_t __thiscall json::Value::size(Value *this)

{
  if (this->type == Array) {
    return (long)(((this->field_1).arr)->
                 super__Vector_base<json::Value::Ref,_std::allocator<json::Value::Ref>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(((this->field_1).arr)->
                 super__Vector_base<json::Value::Ref,_std::allocator<json::Value::Ref>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 4;
  }
  __assert_fail("isArray()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/json.h"
                ,0x185,"size_t json::Value::size()");
}

Assistant:

bool isArray() { return type == Array; }